

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

ggml_threadpool *
ggml_threadpool_new_impl(ggml_threadpool_params *tpp,ggml_cgraph *cgraph,ggml_cplan *cplan)

{
  char *pcVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  int iVar4;
  pthread_mutex_t *__mutex;
  void *__s;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  pthread_t *__newthread;
  undefined1 (*pauVar10) [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  
  __mutex = (pthread_mutex_t *)ggml_aligned_malloc(0x140);
  *(ggml_cgraph **)((long)__mutex + 0x58) = cgraph;
  *(ggml_cplan **)((long)__mutex + 0x60) = cplan;
  iVar9 = 0;
  LOCK();
  *(undefined4 *)((long)__mutex + 0x68) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x80) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0xc0) = 0;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x100) = 0;
  UNLOCK();
  LOCK();
  *(undefined1 *)((long)__mutex + 0x104) = 0;
  UNLOCK();
  LOCK();
  *(_Bool *)((long)__mutex + 0x105) = tpp->paused;
  UNLOCK();
  LOCK();
  *(undefined4 *)((long)__mutex + 0x108) = 0xffffffff;
  UNLOCK();
  *(undefined8 *)((long)__mutex + 0x110) = 0;
  iVar6 = tpp->n_threads;
  __mutex[7].__data.__lock = iVar6;
  LOCK();
  *(int *)((long)__mutex + 0x11c) = iVar6;
  UNLOCK();
  *(undefined8 *)((long)__mutex + 0x120) = *(undefined8 *)&tpp->prio;
  *(undefined4 *)((long)__mutex + 0x128) = 0;
  __s = (void *)ggml_aligned_malloc((long)iVar6 * 0x220);
  memset(__s,0,(long)iVar6 * 0x220);
  if (0 < tpp->n_threads) {
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x220));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar18._8_4_ = 8;
    auVar18._0_8_ = 0x800000008;
    auVar18._12_4_ = 8;
    auVar18._16_4_ = 8;
    auVar18._20_4_ = 8;
    auVar18._24_4_ = 8;
    auVar18._28_4_ = 8;
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastq_avx512f();
    uVar5 = (ulong)(tpp->n_threads + 7U & 0xfffffff8);
    auVar16 = vpbroadcastq_avx512f();
    do {
      auVar17 = vpmullq_avx512dq(auVar11,auVar12);
      uVar3 = vpcmpuq_avx512f(auVar11,auVar16,2);
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      uVar5 = uVar5 - 8;
      auVar17 = vpaddq_avx512f(auVar15,auVar17);
      vpscatterqq_avx512f(ZEXT864(0x210) + auVar17,uVar3,auVar14);
      vpscatterqd_avx512f(ZEXT832(0x218) + auVar17._0_32_,uVar3,auVar2);
      auVar2 = vpaddd_avx2(auVar2,auVar18);
    } while (uVar5 != 0);
  }
  *(void **)((long)__mutex + 0x110) = __s;
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
  if (1 < tpp->n_threads) {
    lVar8 = 1;
    iVar9 = 0;
    do {
      pauVar10 = (undefined1 (*) [64])((long)__s + lVar8 * 0x220 + 8);
      if (tpp->strict_cpu == false) {
        memcpy(pauVar10,tpp,0x200);
      }
      else {
        auVar12 = ZEXT1664((undefined1  [16])0x0);
        iVar4 = 0x200;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[7] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[6] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[5] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[4] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[3] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[2] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        pauVar10[1] = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        *pauVar10 = auVar11;
        iVar6 = iVar9;
        do {
          iVar7 = iVar6 + -0x200;
          if (iVar6 < 0x200) {
            iVar7 = iVar6;
          }
          if (tpp->cpumask[iVar7] == true) {
            *(undefined1 *)((long)*pauVar10 + (long)iVar7) = 1;
            iVar9 = iVar7 + 1;
            break;
          }
          iVar6 = iVar6 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      __newthread = (pthread_t *)(lVar8 * 0x220 + (long)__s);
      iVar6 = pthread_create(__newthread,(pthread_attr_t *)0x0,ggml_graph_compute_secondary_thread,
                             __newthread);
      if (iVar6 != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0xbfe,"GGML_ASSERT(%s) failed","rc == 0");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < tpp->n_threads);
  }
  pauVar10 = (undefined1 (*) [64])((long)__s + 8);
  if (tpp->strict_cpu == false) {
    memcpy(pauVar10,tpp,0x200);
  }
  else {
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    iVar6 = 0x200;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x1c8) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x188) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x148) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x108) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 200) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x88) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)__s + 0x48) = auVar11;
    auVar11 = vmovdqu64_avx512f(auVar12);
    *pauVar10 = auVar11;
    do {
      iVar4 = iVar9 + -0x200;
      if (iVar9 < 0x200) {
        iVar4 = iVar9;
      }
      if (tpp->cpumask[iVar4] == true) {
        (*pauVar10)[iVar4] = 1;
        break;
      }
      iVar9 = iVar9 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  if ((*(byte *)((long)__mutex + 0x105) & 1) == 0) {
    ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
    lVar8 = *(long *)((long)__mutex + 0x110);
    if (*(char *)(lVar8 + 8) == '\0') {
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 == 0x1fe) {
          return (ggml_threadpool *)__mutex;
        }
        pcVar1 = (char *)(lVar8 + 10 + uVar5);
        uVar5 = uVar5 + 1;
      } while (*pcVar1 != '\x01');
      if (0x1fe < uVar5) {
        return (ggml_threadpool *)__mutex;
      }
    }
    ggml_thread_apply_affinity((_Bool *)(lVar8 + 8));
  }
  return (ggml_threadpool *)__mutex;
}

Assistant:

static struct ggml_threadpool * ggml_threadpool_new_impl(
    struct ggml_threadpool_params * tpp,
               struct ggml_cgraph * cgraph,
                struct ggml_cplan * cplan) {

    struct ggml_threadpool * threadpool =
        ggml_aligned_malloc(sizeof(struct ggml_threadpool));
    {
        threadpool->cgraph           = cgraph;
        threadpool->cplan            = cplan;
        threadpool->n_graph          = 0;
        threadpool->n_barrier        = 0;
        threadpool->n_barrier_passed = 0;
        threadpool->current_chunk    = 0;
        threadpool->stop             = false;
        threadpool->pause            = tpp->paused;
        threadpool->abort            = -1;
        threadpool->workers          = NULL;
        threadpool->n_threads_max    = tpp->n_threads;
        threadpool->n_threads_cur    = tpp->n_threads;
        threadpool->poll             = tpp->poll;
        threadpool->prio             = tpp->prio;
        threadpool->ec               = GGML_STATUS_SUCCESS;
    }

    // Allocate and init workers state
    const size_t workers_size = sizeof(struct ggml_compute_state) * tpp->n_threads;
    struct ggml_compute_state * workers = ggml_aligned_malloc(workers_size);

    memset(workers, 0, workers_size);
    for (int j = 0; j < tpp->n_threads; j++) {
        workers[j].threadpool = threadpool;
        workers[j].ith        = j;
    }

    threadpool->workers = workers;

#ifndef GGML_USE_OPENMP
    ggml_mutex_init(&threadpool->mutex);
    ggml_cond_init(&threadpool->cond);

    // Spin the threads for all workers, and update CPU placements.
    // Place the main thread last (towards the higher numbered CPU cores).

    int32_t cpumask_iter = 0;

    for (int j = 1; j < tpp->n_threads; j++) {
        ggml_thread_cpumask_next(tpp->cpumask, workers[j].cpumask, tpp->strict_cpu, &cpumask_iter);

        int32_t rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_secondary_thread, &workers[j]);
        GGML_ASSERT(rc == 0);
    }

    ggml_thread_cpumask_next(tpp->cpumask, workers[0].cpumask, tpp->strict_cpu, &cpumask_iter);

    if (!threadpool->pause) {
        // Update main thread prio and affinity at the start, otherwise we'll do it in resume
        ggml_thread_apply_priority(threadpool->prio);
        if (ggml_thread_cpumask_is_valid(threadpool->workers[0].cpumask)) {
            ggml_thread_apply_affinity(threadpool->workers[0].cpumask);
        }
    }
#endif // GGML_USE_OPENMP

    return threadpool;
}